

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_init(mk_server *server)

{
  int iVar1;
  long *ptr;
  void *pvVar2;
  mk_sched_ctx *ctx;
  int size;
  mk_server *server_local;
  
  ptr = (long *)mk_mem_alloc_z(8);
  if (ptr == (long *)0x0) {
    mk_utils_libc_error("malloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
                        ,0x1da);
    server_local._4_4_ = -1;
  }
  else {
    iVar1 = server->workers * 0xa0;
    pvVar2 = mk_mem_alloc((long)iVar1);
    *ptr = (long)pvVar2;
    if (*ptr == 0) {
      mk_utils_libc_error("malloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
                          ,0x1e1);
      mk_mem_free(ptr);
      server_local._4_4_ = -1;
    }
    else {
      memset((void *)*ptr,0,(long)iVar1);
      pthread_mutex_init((pthread_mutex_t *)&server->pth_mutex,(pthread_mutexattr_t *)0x0);
      pthread_cond_init((pthread_cond_t *)&server->pth_cond,(pthread_condattr_t *)0x0);
      server->pth_init = 0;
      server->sched_ctx = ptr;
      server_local._4_4_ = 0;
    }
  }
  return server_local._4_4_;
}

Assistant:

int mk_sched_init(struct mk_server *server)
{
    int size;
    struct mk_sched_ctx *ctx;

    ctx = mk_mem_alloc_z(sizeof(struct mk_sched_ctx));
    if (!ctx) {
        mk_libc_error("malloc");
        return -1;
    }

    size = (sizeof(struct mk_sched_worker) * server->workers);
    ctx->workers = mk_mem_alloc(size);
    if (!ctx->workers) {
        mk_libc_error("malloc");
        mk_mem_free(ctx);
        return -1;
    }
    memset(ctx->workers, '\0', size);

    /* Initialize helpers */
    pthread_mutex_init(&server->pth_mutex, NULL);
    pthread_cond_init(&server->pth_cond, NULL);
    server->pth_init = MK_FALSE;

    /* Map context into server context */
    server->sched_ctx = ctx;

    /* The mk_thread_prepare call was replaced by mk_http_thread_initialize_tls
     * which is called earlier.
     */

    return 0;
}